

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *keyval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  pointer __s1;
  size_t __n;
  size_type *psVar6;
  _Manager_type p_Var7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  ulong insertion_idx;
  uint8_t *puVar13;
  string *this_00;
  NodePtr pDVar14;
  long lVar15;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type local_38;
  
  do {
    sVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)keyval);
    uVar12 = ((uint)sVar9 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar5 = *(int *)(this + 0x28);
    insertion_idx = sVar9 >> 5 & *(ulong *)(this + 0x18);
    lVar15 = *(long *)(this + 8);
    bVar4 = *(byte *)(lVar15 + insertion_idx);
    while( true ) {
      uVar12 = uVar12 + iVar5;
      if (bVar4 <= uVar12) break;
      bVar4 = *(byte *)(lVar15 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar12 == bVar4) {
      __s1 = (keyval->mData).first._M_dataplus._M_p;
      __n = (keyval->mData).first._M_string_length;
      pDVar14 = (NodePtr)(insertion_idx * 0x40 + *(long *)this);
      do {
        if ((__n == (pDVar14->mData).first._M_string_length) &&
           ((__n == 0 ||
            (iVar8 = bcmp(__s1,(pDVar14->mData).first._M_dataplus._M_p,__n), iVar8 == 0)))) {
          puVar13 = (uint8_t *)(lVar15 + insertion_idx);
          bVar11 = false;
          goto LAB_001fc0f2;
        }
        uVar12 = uVar12 + iVar5;
        pbVar3 = (byte *)(lVar15 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        pDVar14 = pDVar14 + 1;
      } while (uVar12 == *pbVar3);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar5 + uVar12) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar10 = 1;
      do {
        lVar10 = lVar10 + -1;
        pcVar2 = (char *)(lVar15 + insertion_idx);
        lVar15 = lVar15 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(*(long *)this + insertion_idx * 0x40);
      if (lVar10 == 0) {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::
        DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
        ::DataNode((DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                    *)this_00,
                   (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,keyval);
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar10,insertion_idx);
        local_70 = &local_60;
        psVar6 = (size_type *)(keyval->mData).first._M_dataplus._M_p;
        paVar1 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6 == paVar1) {
          local_60 = paVar1->_M_allocated_capacity;
          uStack_58 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
        }
        else {
          local_60 = paVar1->_M_allocated_capacity;
          local_70 = psVar6;
        }
        local_68 = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        local_40 = (_Manager_type)0x0;
        local_50._M_unused._M_object = (void *)0x0;
        local_50._8_8_ = 0;
        local_38 = (keyval->mData).second._M_invoker;
        p_Var7 = (keyval->mData).second.super__Function_base._M_manager;
        if (p_Var7 != (_Manager_type)0x0) {
          local_50._M_unused._0_8_ =
               (undefined8)*(undefined8 *)&(keyval->mData).second.super__Function_base._M_functor;
          local_50._8_8_ =
               *(undefined8 *)((long)&(keyval->mData).second.super__Function_base._M_functor + 8);
          (keyval->mData).second.super__Function_base._M_manager = (_Manager_type)0x0;
          (keyval->mData).second._M_invoker = (_Invoker_type)0x0;
          local_40 = p_Var7;
        }
        std::__cxx11::string::operator=(this_00,(string *)&local_70);
        std::
        function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
        ::operator=((function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
                     *)(this_00 + 0x20),
                    (function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
                     *)&local_50);
        if (local_40 != (_Manager_type)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar12;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      pDVar14 = (NodePtr)(insertion_idx * 0x40 + *(long *)this);
      puVar13 = (uint8_t *)(insertion_idx + *(long *)(this + 8));
      bVar11 = true;
LAB_001fc0f2:
      (__return_storage_ptr__->first).mKeyVals = pDVar14;
      (__return_storage_ptr__->first).mInfo = puVar13;
      __return_storage_ptr__->second = bVar11;
      return __return_storage_ptr__;
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

std::pair<iterator, bool> doInsert(Arg&& keyval) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(getFirstConst(keyval), &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(getFirstConst(keyval), mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair<iterator, bool>(iterator(mKeyVals + idx, mInfo + idx),
                                                          false);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                ::new (static_cast<void*>(&l)) Node(*this, std::forward<Arg>(keyval));
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::forward<Arg>(keyval));
            }

            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return std::make_pair(iterator(mKeyVals + insertion_idx, mInfo + insertion_idx), true);
        }
    }